

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

wchar_t * fmt::v5::internal::
          format_decimal<unsigned_long,wchar_t,fmt::v5::internal::no_thousands_sep>
                    (long buffer,ulong value,uint num_digits)

{
  uint uVar1;
  int *piVar2;
  long local_8;
  
  piVar2 = (int *)(buffer + (ulong)num_digits * 4 + -4);
  for (; 99 < value; value = value / 100) {
    *piVar2 = (int)(char)basic_data<void>::DIGITS[(value % 100) * 2 + 1];
    piVar2[-1] = (int)(char)basic_data<void>::DIGITS[(value % 100) * 2];
    piVar2 = piVar2 + -2;
  }
  if (value < 10) {
    uVar1 = (uint)value | 0x30;
    local_8 = -4;
  }
  else {
    *piVar2 = (int)(char)basic_data<void>::DIGITS[((value & 0xffffffff) * 2 & 0xffffffff) + 1];
    uVar1 = (uint)(char)basic_data<void>::DIGITS[(value & 0xffffffff) * 2];
    local_8 = -8;
  }
  *(uint *)((long)piVar2 + local_8 + 4) = uVar1;
  return (wchar_t *)(buffer + (ulong)num_digits * 4);
}

Assistant:

inline Char *format_decimal(Char *buffer, UInt value, unsigned num_digits,
                            ThousandsSep thousands_sep) {
  buffer += num_digits;
  Char *end = buffer;
  while (value >= 100) {
    // Integer division is slow so do it for a group of two digits instead
    // of for every digit. The idea comes from the talk by Alexandrescu
    // "Three Optimization Tips for C++". See speed-test for a comparison.
    unsigned index = static_cast<unsigned>((value % 100) * 2);
    value /= 100;
    *--buffer = data::DIGITS[index + 1];
    thousands_sep(buffer);
    *--buffer = data::DIGITS[index];
    thousands_sep(buffer);
  }
  if (value < 10) {
    *--buffer = static_cast<char>('0' + value);
    return end;
  }
  unsigned index = static_cast<unsigned>(value * 2);
  *--buffer = data::DIGITS[index + 1];
  thousands_sep(buffer);
  *--buffer = data::DIGITS[index];
  return end;
}